

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O1

void duckdb::EquiWidthBinFunction<long,duckdb::EquiWidthBinsInteger>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  idx_t bin_count;
  Expression *pEVar5;
  _Alloc_hider _Var6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  UnifiedVectorFormat *pUVar11;
  reference pvVar12;
  pointer pPVar13;
  InvalidInputException *pIVar14;
  UnifiedVectorFormat *pUVar15;
  pointer pPVar16;
  UnifiedVectorFormat *pUVar17;
  UnifiedVectorFormat *pUVar18;
  UnifiedVectorFormat *pUVar19;
  UnifiedVectorFormat *i;
  bool bVar20;
  STRUCT_STATE a_state;
  STRUCT_STATE d_state;
  STRUCT_STATE c_state;
  STRUCT_STATE b_state;
  Vector intermediate_result;
  string local_238;
  ExpressionState *local_210;
  vector<duckdb::PrimitiveType<long>,_true> local_208;
  Vector *local_1f0;
  GenericListType<duckdb::PrimitiveType<long>_> local_1e8;
  LogicalType local_1d0 [24];
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  long *local_170;
  long local_168;
  long local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long *local_128;
  long local_120;
  long local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Vector local_98 [8];
  LogicalType local_90 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_210 = state;
  local_1f0 = result;
  pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  pvVar9 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,3);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_1b8,BIGINT);
  duckdb::LogicalType::LIST(local_1d0);
  duckdb::Vector::Vector(local_98,local_1d0,0x800);
  duckdb::LogicalType::~LogicalType(local_1d0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_1b8);
  bVar20 = false;
  if (((*pvVar7 == (value_type)0x2) && (*pvVar8 == (value_type)0x2)) && (*pvVar9 == (value_type)0x2)
     ) {
    bVar20 = *pvVar10 == (value_type)0x2;
  }
  pUVar19 = *(UnifiedVectorFormat **)(args + 0x18);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_1b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_128);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_170);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar7,pUVar19);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar8,pUVar19);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar9,pUVar19);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar10,pUVar19);
  if (bVar20) {
    pUVar19 = (UnifiedVectorFormat *)0x1;
  }
  if (pUVar19 != (UnifiedVectorFormat *)0x0) {
    i = (UnifiedVectorFormat *)0x0;
    do {
      lVar1 = *local_1b8;
      pUVar17 = i;
      if (lVar1 != 0) {
        pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar1 + (long)i * 4);
      }
      lVar2 = *local_e0;
      pUVar11 = i;
      if (lVar2 != 0) {
        pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar2 + (long)i * 4);
      }
      lVar3 = *local_128;
      pUVar15 = i;
      if (lVar3 != 0) {
        pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar3 + (long)i * 4);
      }
      lVar4 = *local_170;
      pUVar18 = i;
      if (lVar4 != 0) {
        pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)i * 4);
      }
      if (((((local_1a8 == 0) ||
            ((*(ulong *)(local_1a8 + ((ulong)pUVar17 >> 6) * 8) >> ((ulong)pUVar17 & 0x3f) & 1) != 0
            )) && ((local_d0 == 0 ||
                   ((*(ulong *)(local_d0 + ((ulong)pUVar11 >> 6) * 8) >> ((ulong)pUVar11 & 0x3f) & 1
                    ) != 0)))) &&
          ((local_118 == 0 ||
           ((*(ulong *)(local_118 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) != 0)
           ))) && ((local_160 == 0 ||
                   ((*(ulong *)(local_160 + ((ulong)pUVar18 >> 6) * 8) >> ((ulong)pUVar18 & 0x3f) &
                    1) != 0)))) {
        pUVar17 = i;
        if (lVar1 != 0) {
          pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar1 + (long)i * 4);
        }
        pUVar11 = i;
        if (lVar2 != 0) {
          pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar2 + (long)i * 4);
        }
        pUVar15 = i;
        if (lVar3 != 0) {
          pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar3 + (long)i * 4);
        }
        pUVar18 = i;
        if (lVar4 != 0) {
          pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)i * 4);
        }
        pPVar16 = *(pointer *)(local_1b0 + (long)pUVar17 * 8);
        pPVar13 = *(pointer *)(local_d8 + (long)pUVar11 * 8);
        if ((long)pPVar13 < (long)pPVar16) {
          pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar5 = *(Expression **)(local_210 + 8);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "Invalid input for bin function - max value is smaller than min value","");
          InvalidInputException::InvalidInputException<>(pIVar14,pEVar5,&local_238);
          __cxa_throw(pIVar14,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        bin_count = *(idx_t *)(local_120 + (long)pUVar15 * 8);
        if ((long)bin_count < 1) {
          pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar5 = *(Expression **)(local_210 + 8);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"Invalid input for bin function - there must be > 0 bins",
                     "");
          InvalidInputException::InvalidInputException<>(pIVar14,pEVar5,&local_238);
          __cxa_throw(pIVar14,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (1000000 < (long)bin_count) {
          pIVar14 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          pEVar5 = *(Expression **)(local_210 + 8);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,
                     "Invalid input for bin function - max bin count of %d exceeded","");
          InvalidInputException::InvalidInputException<long>(pIVar14,pEVar5,&local_238,1000000);
          __cxa_throw(pIVar14,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        local_238._M_dataplus._M_p = (pointer)0x0;
        local_238._M_string_length = 0;
        local_238.field_2._M_allocated_capacity = 0;
        if (pPVar13 == pPVar16) {
          local_208.
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pPVar13;
          std::vector<duckdb::PrimitiveType<long>,std::allocator<duckdb::PrimitiveType<long>>>::
          _M_realloc_insert<duckdb::PrimitiveType<long>>
                    ((vector<duckdb::PrimitiveType<long>,std::allocator<duckdb::PrimitiveType<long>>>
                      *)&local_238,(iterator)0x0,(PrimitiveType<long> *)&local_208);
        }
        else {
          EquiWidthBinsInteger::Operation
                    (&local_208,*(Expression **)(local_210 + 8),(int64_t)pPVar16,(int64_t)pPVar13,
                     bin_count,(bool)pUVar18[local_168]);
          _Var6._M_p = local_238._M_dataplus._M_p;
          local_238._M_dataplus._M_p =
               (pointer)local_208.
                        super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                        .
                        super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_238._M_string_length =
               (size_type)
               local_208.
               super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
               .
               super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_238.field_2._M_allocated_capacity =
               (size_type)
               local_208.
               super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
               .
               super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_208.
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pointer)_Var6._M_p != (pointer)0x0) {
            operator_delete(_Var6._M_p);
          }
          if (local_208.
              super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
              .
              super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_208.
                            super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                            .
                            super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          pvVar12 = vector<duckdb::PrimitiveType<long>,_true>::operator[]
                              ((vector<duckdb::PrimitiveType<long>,_true> *)&local_238,0);
          if (pvVar12->val < (long)pPVar13) {
            pvVar12 = vector<duckdb::PrimitiveType<long>,_true>::operator[]
                                ((vector<duckdb::PrimitiveType<long>,_true> *)&local_238,0);
            pvVar12->val = (long)pPVar13;
          }
          pPVar16 = (pointer)(local_238._M_string_length + -8);
          _Var6._M_p = local_238._M_dataplus._M_p;
          if (local_238._M_dataplus._M_p < pPVar16 &&
              local_238._M_dataplus._M_p != (pointer)local_238._M_string_length) {
            do {
              pPVar13 = (pointer)((long)_Var6._M_p + 8);
              lVar1 = ((pointer)_Var6._M_p)->val;
              ((pointer)_Var6._M_p)->val = pPVar16->val;
              pPVar16->val = lVar1;
              pPVar16 = pPVar16 + -1;
              _Var6._M_p = (pointer)pPVar13;
            } while (pPVar13 < pPVar16);
          }
        }
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
        super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._M_dataplus._M_p;
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
        super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_238._M_string_length;
        local_1e8.values.
        super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
        super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_238.field_2._M_allocated_capacity;
        GenericListType<duckdb::PrimitiveType<long>_>::AssignResult(local_98,(idx_t)i,&local_1e8);
        if (local_1e8.values.
            super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
            .
            super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.values.
                          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                          .
                          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        duckdb::FlatVector::SetNull(local_98,(ulong)i,true);
      }
      i = i + 1;
    } while (i != pUVar19);
  }
  if (bVar20) {
    duckdb::Vector::SetVectorType((VectorType)local_98);
  }
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
  }
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  duckdb::VectorOperations::DefaultCast(local_98,local_1f0,*(ulong *)(args + 0x18),false);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  return;
}

Assistant:

static void EquiWidthBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	static constexpr int64_t MAX_BIN_COUNT = 1000000;
	auto &min_arg = args.data[0];
	auto &max_arg = args.data[1];
	auto &bin_count = args.data[2];
	auto &nice_rounding = args.data[3];

	Vector intermediate_result(LogicalType::LIST(OP::LOGICAL_TYPE));
	GenericExecutor::ExecuteQuaternary<PrimitiveType<T>, PrimitiveType<T>, PrimitiveType<int64_t>, PrimitiveType<bool>,
	                                   GenericListType<PrimitiveType<T>>>(
	    min_arg, max_arg, bin_count, nice_rounding, intermediate_result, args.size(),
	    [&](PrimitiveType<T> min_p, PrimitiveType<T> max_p, PrimitiveType<int64_t> bins_p,
	        PrimitiveType<bool> nice_rounding_p) {
		    if (max_p.val < min_p.val) {
			    throw InvalidInputException(state.expr,
			                                "Invalid input for bin function - max value is smaller than min value");
		    }
		    if (bins_p.val <= 0) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - there must be > 0 bins");
		    }
		    if (bins_p.val > MAX_BIN_COUNT) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - max bin count of %d exceeded",
			                                MAX_BIN_COUNT);
		    }
		    GenericListType<PrimitiveType<T>> result_bins;
		    if (max_p.val == min_p.val) {
			    // if max = min return a single bucket
			    result_bins.values.push_back(max_p.val);
		    } else {
			    result_bins.values = OP::Operation(state.expr, min_p.val, max_p.val, static_cast<idx_t>(bins_p.val),
			                                       nice_rounding_p.val);
			    // last bin should always be the input max
			    if (result_bins.values[0].val < max_p.val) {
				    result_bins.values[0].val = max_p.val;
			    }
			    std::reverse(result_bins.values.begin(), result_bins.values.end());
		    }
		    return result_bins;
	    });
	VectorOperations::DefaultCast(intermediate_result, result, args.size());
}